

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

void __thiscall fasttext::Loss::Loss(Loss *this,shared_ptr<fasttext::Matrix> *wo)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  real x_1;
  int i_1;
  real x;
  int i;
  value_type_conflict *in_stack_ffffffffffffff88;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff90;
  vector<float,_std::allocator<float>_> *pvVar1;
  int local_2c;
  int local_20;
  
  *in_RDI = &PTR__Loss_001cb9b8;
  pvVar1 = (vector<float,_std::allocator<float>_> *)(in_RDI + 1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x19e254);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x19e267);
  in_RDI[7] = in_RSI;
  std::vector<float,_std::allocator<float>_>::reserve(pvVar1,(size_type)in_RDI);
  for (local_20 = 0; local_20 < 0x201; local_20 = local_20 + 1) {
    std::exp((double)((ulong)(uint)((float)((long)(local_20 * 2) << 3) * 0.001953125 + -8.0) ^
                     0x8000000080000000));
    std::vector<float,_std::allocator<float>_>::push_back
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  std::vector<float,_std::allocator<float>_>::reserve(pvVar1,(size_type)in_RDI);
  for (local_2c = 0; local_2c < 0x201; local_2c = local_2c + 1) {
    pvVar1 = (vector<float,_std::allocator<float>_> *)(in_RDI + 4);
    std::log((double)(ulong)(uint)(((float)local_2c + 1e-05) * 0.001953125));
    std::vector<float,_std::allocator<float>_>::push_back(pvVar1,in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

Loss::Loss(std::shared_ptr<Matrix>& wo) : wo_(wo) {
  t_sigmoid_.reserve(SIGMOID_TABLE_SIZE + 1);
  for (int i = 0; i < SIGMOID_TABLE_SIZE + 1; i++) {
    real x = real(i * 2 * MAX_SIGMOID) / SIGMOID_TABLE_SIZE - MAX_SIGMOID;
    t_sigmoid_.push_back(1.0 / (1.0 + std::exp(-x)));
  }

  t_log_.reserve(LOG_TABLE_SIZE + 1);
  for (int i = 0; i < LOG_TABLE_SIZE + 1; i++) {
    real x = (real(i) + 1e-5) / LOG_TABLE_SIZE;
    t_log_.push_back(std::log(x));
  }
}